

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

Curl_easy * duphandle(Curl_easy *data)

{
  void *pvVar1;
  HTTP *http;
  Curl_easy *second;
  Curl_easy *data_local;
  
  second = data;
  http = (HTTP *)curl_easy_duphandle(data);
  if ((CURL_conflict *)http != (CURL_conflict *)0x0) {
    pvVar1 = (*Curl_ccalloc)(1,0x2e8);
    if (pvVar1 == (void *)0x0) {
      Curl_close((Curl_easy **)&http);
    }
    else {
      *(void **)((http->form).encstate.buf + 0xc0) = pvVar1;
      Curl_dyn_init((dynbuf *)((long)pvVar1 + 0x230),0x20000);
      Curl_http2_setup_req((Curl_easy *)http);
      *(int *)&http[6].form.easy = (second->state).stream_weight;
    }
  }
  return (Curl_easy *)http;
}

Assistant:

static struct Curl_easy *duphandle(struct Curl_easy *data)
{
  struct Curl_easy *second = curl_easy_duphandle(data);
  if(second) {
    /* setup the request struct */
    struct HTTP *http = calloc(1, sizeof(struct HTTP));
    if(!http) {
      (void)Curl_close(&second);
    }
    else {
      second->req.p.http = http;
      Curl_dyn_init(&http->header_recvbuf, DYN_H2_HEADERS);
      Curl_http2_setup_req(second);
      second->state.stream_weight = data->state.stream_weight;
    }
  }
  return second;
}